

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_dns_record.c
# Opt level: O3

ares_status_t
ares_dns_rr_set_abin_own(ares_dns_rr_t *dns_rr,ares_dns_rr_key_t key,ares_dns_multistring_t *strs)

{
  ares_dns_datatype_t aVar1;
  undefined8 *puVar2;
  ares_status_t aVar3;
  
  aVar1 = ares_dns_rr_key_datatype(key);
  aVar3 = ARES_EFORMERR;
  if (aVar1 == ARES_DATATYPE_ABINP) {
    puVar2 = (undefined8 *)ares_dns_rr_data_ptr(dns_rr,key,(size_t **)0x0);
    if (puVar2 != (undefined8 *)0x0) {
      if ((ares_dns_multistring_t *)*puVar2 != (ares_dns_multistring_t *)0x0) {
        ares_dns_multistring_destroy((ares_dns_multistring_t *)*puVar2);
      }
      *puVar2 = strs;
      aVar3 = ARES_SUCCESS;
    }
  }
  return aVar3;
}

Assistant:

ares_status_t ares_dns_rr_set_abin_own(ares_dns_rr_t          *dns_rr,
                                       ares_dns_rr_key_t       key,
                                       ares_dns_multistring_t *strs)
{
  ares_dns_multistring_t **strs_ptr;

  if (ares_dns_rr_key_datatype(key) != ARES_DATATYPE_ABINP) {
    return ARES_EFORMERR;
  }

  strs_ptr = ares_dns_rr_data_ptr(dns_rr, key, NULL);
  if (strs_ptr == NULL) {
    return ARES_EFORMERR;
  }

  if (*strs_ptr != NULL) {
    ares_dns_multistring_destroy(*strs_ptr);
  }
  *strs_ptr = strs;

  return ARES_SUCCESS;
}